

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O1

Ref<embree::Image> __thiscall embree::loadPFM(embree *this,FileName *fileName)

{
  pointer pcVar1;
  int iVar2;
  ImageT<embree::Col4<float>_> *this_00;
  runtime_error *prVar3;
  size_t width_00;
  long lVar4;
  size_t height_00;
  long lVar5;
  int width;
  char cty [2];
  int height;
  float maxColor;
  Ref<embree::Image> *img;
  float rgb [3];
  string type;
  fstream file;
  undefined1 auStack_2d8 [8];
  int local_2d0;
  undefined2 local_2ca;
  int local_2c8;
  float local_2c4;
  Image *local_2c0;
  undefined1 local_2b8 [16];
  float local_2a4 [3];
  undefined1 local_298 [8];
  float fStack_290;
  undefined4 uStack_28c;
  char local_288 [16];
  undefined2 *local_278;
  undefined8 local_270;
  undefined2 local_268;
  undefined1 local_266;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  long local_240 [3];
  undefined4 auStack_224 [125];
  
  local_2c0 = (Image *)this;
  std::fstream::fstream(local_240);
  lVar5 = *(long *)(local_240[0] + -0x18);
  *(undefined4 *)((long)auStack_224 + lVar5) = 5;
  std::ios::clear((int)auStack_2d8 + (int)lVar5 + 0x98);
  std::fstream::open((char *)local_240,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  std::istream::read((char *)local_240,(long)&local_2ca);
  skipSpacesAndComments((fstream *)local_240);
  local_278 = &local_268;
  local_268 = local_2ca;
  local_270 = 2;
  local_266 = 0;
  std::istream::operator>>((istream *)local_240,&local_2d0);
  skipSpacesAndComments((fstream *)local_240);
  std::istream::operator>>((istream *)local_240,&local_2c8);
  skipSpacesAndComments((fstream *)local_240);
  std::istream::_M_extract<float>((float *)local_240);
  local_2b8._0_4_ = local_2c4;
  if (0.0 < local_2c4) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Big endian PFM files not supported");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::ignore();
  this_00 = (ImageT<embree::Col4<float>_> *)operator_new(0x48);
  width_00 = (size_t)local_2d0;
  height_00 = (size_t)local_2c8;
  pcVar1 = (fileName->filename)._M_dataplus._M_p;
  local_298 = (undefined1  [8])local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + (fileName->filename)._M_string_length);
  ImageT<embree::Col4<float>_>::ImageT(this_00,width_00,height_00,(string *)local_298);
  (local_2c0->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_278);
  if (iVar2 == 0) {
    lVar5 = (long)local_2c8;
    if (0 < lVar5) {
      local_258 = -1.0 / (float)local_2b8._0_4_;
      local_2b8 = ZEXT416((uint)local_258);
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      do {
        lVar5 = lVar5 + -1;
        if (0 < local_2d0) {
          lVar4 = 0;
          do {
            std::istream::read((char *)local_240,(long)local_2a4);
            fStack_290 = SUB84(local_2a4._4_8_,4) * fStack_254;
            local_298._4_4_ = (float)local_2a4._4_8_ * local_258;
            local_298._0_4_ = local_2a4[0] * (float)local_2b8._0_4_;
            uStack_28c = 0x3f800000;
            (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                      (this_00,lVar4,lVar5,local_298);
            lVar4 = lVar4 + 1;
          } while (lVar4 < local_2d0);
        }
      } while (0 < lVar5);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    std::fstream::~fstream(local_240);
    return (Ref<embree::Image>)local_2c0;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Invalid magic value in PFM file");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadPFM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    float maxColor; file >> maxColor;
    if (maxColor > 0) THROW_RUNTIME_ERROR("Big endian PFM files not supported");
    float rcpMaxColor = -1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* image in binary format 16 bit */
    if (type == "PF")
    {
      float rgb[3];
      for (ssize_t y=height-1; y>=0; y--) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(rgb[0]*rcpMaxColor,rgb[1]*rcpMaxColor,rgb[2]*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PFM file");
    }
    return img;
  }